

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_next_on_array(uint32_t count)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  uint32_t uVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  byte *pbVar9;
  long k;
  char *d3;
  char *d2;
  byte *local_40;
  char *local_38;
  
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"next/check on array(%u)",count);
  fputc(10,_stdout);
  if (count < 0x10) {
    buf[1] = (byte)count | 0x90;
    pcVar7 = buf + 2;
  }
  else if (count < 0x10000) {
    buf[1] = -0x24;
    uVar2 = (ushort)count << 8 | (ushort)count >> 8;
    buf[2] = (char)uVar2;
    buf[3] = (char)(uVar2 >> 8);
    pcVar7 = buf + 4;
  }
  else {
    buf[1] = -0x23;
    buf._2_4_ = count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
    pcVar7 = buf + 6;
  }
  if (count != 0) {
    uVar4 = 0;
    uVar5 = count;
    do {
      iVar3 = (int)(uVar4 * 0x2040811 >> 0x20);
      uVar8 = ((uint)((int)uVar4 - iVar3) >> 1) + iVar3 >> 6;
      *pcVar7 = (char)uVar4 - ((char)(uVar8 << 7) - (char)uVar8);
      pcVar7 = pcVar7 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  iVar3 = 1;
  if (0xf < count) {
    iVar3 = (0xffff < count) + 3 + (uint)(0xffff < count);
  }
  uVar8 = iVar3 + count;
  pbVar9 = (byte *)(ulong)uVar8;
  local_38 = buf + 1;
  local_40 = (byte *)(buf + 1);
  iVar3 = mp_check(&local_38,str);
  _ok((uint)(iVar3 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2a9,
      "mp_check(array %u))",count);
  _ok((uint)((byte *)(pcVar7 + -0x154121) == pbVar9),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2aa,
      "len(array %u) == %u",count,uVar8);
  _ok((uint)((byte *)(local_38 + -0x154121) == pbVar9),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ab,
      "len(mp_check(array %u)) == %u",count,uVar8);
  k = 1;
  do {
    lVar6 = (long)""[*local_40];
    if (lVar6 < 0) {
      if (*local_40 == 0xd9) {
        local_40 = local_40 + (ulong)local_40[1] + 2;
        goto LAB_0012e8d8;
      }
      if (-0x20 < ""[*local_40]) {
        k = k - lVar6;
        local_40 = local_40 + 1;
        goto LAB_0012e8d8;
      }
      mp_next_slowpath((char **)&local_40,k);
      bVar1 = false;
      lVar6 = k;
    }
    else {
      local_40 = local_40 + 1 + lVar6;
LAB_0012e8d8:
      bVar1 = true;
      lVar6 = k;
    }
    if ((!bVar1) || (k = lVar6 + -1, lVar6 < 2)) {
      _ok((uint)(local_40 + -0x154121 == pbVar9),"(d3 - data) == (ptrdiff_t)len",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x2ad,"len(mp_next(array %u)) == %u",count,uVar8);
      return;
    }
  } while( true );
}

Assistant:

static void
test_next_on_array(uint32_t count)
{
	note("next/check on array(%u)", count);
	char *d1 = data;
	d1 = mp_encode_array(d1, count);
	for (uint32_t i = 0; i < count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = count + mp_sizeof_array(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(array %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(array %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(array %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(array %u)) == %u", count, len);
}